

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

void MOJOSHADER_glDestroyContext(MOJOSHADER_glContext *_ctx)

{
  MOJOSHADER_glContext *pMVar1;
  MOJOSHADER_glContext *pMVar2;
  
  pMVar2 = ctx;
  ctx = _ctx;
  MOJOSHADER_glBindProgram((MOJOSHADER_glProgram *)0x0);
  if (ctx->linker_cache != (HashTable *)0x0) {
    hash_destroy(ctx->linker_cache);
  }
  pMVar1 = ctx;
  ctx->have_opengl_3 = 0;
  pMVar1->have_core_opengl = 0;
  pMVar1->have_opengl_2 = 0;
  pMVar1->have_GL_ARB_vertex_program = 0;
  pMVar1->have_GL_ARB_vertex_shader = 0;
  pMVar1->have_GL_NV_gpu_program4 = 0;
  pMVar1->have_GL_ARB_shader_objects = 0;
  memset(&pMVar1->have_GL_ARB_instanced_arrays,0,0x1bc);
  (*pMVar1->free_fn)(pMVar1,pMVar1->malloc_data);
  if (pMVar2 == _ctx) {
    pMVar2 = (MOJOSHADER_glContext *)0x0;
  }
  ctx = pMVar2;
  return;
}

Assistant:

void MOJOSHADER_glDestroyContext(MOJOSHADER_glContext *_ctx)
{
    MOJOSHADER_glContext *current_ctx = ctx;
    ctx = _ctx;
    MOJOSHADER_glBindProgram(NULL);
    if (ctx->linker_cache)
        hash_destroy(ctx->linker_cache);
    lookup_entry_points(NULL, NULL);   // !!! FIXME: is there a value to this?
    Free(ctx);
    ctx = ((current_ctx == _ctx) ? NULL : current_ctx);
}